

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O0

void LoadTriangles(Level *NewLev,int radius)

{
  Triangle *t;
  Edge *pEVar1;
  int iVar2;
  undefined4 in_ESI;
  long in_RDI;
  bool bVar3;
  int c;
  Edge *NextEdge;
  Triangle *Tri;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar4;
  int local_24;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  ExpectToken(TK_OPENBRACE);
  while( true ) {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    t = NewTriangle();
    GetVert((Level *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),t,
            (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    ExpectToken(TK_OPENBRACE);
    GetVert((Level *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),t,
            (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    ExpectToken(TK_OPENBRACE);
    GetVert((Level *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),t,
            (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    ExpectToken(TK_OPENBRACE);
    ExpectToken(TK_OPENBRACE);
    t->Material = *(Material **)(in_RDI + 0xe0);
    while( true ) {
      iVar2 = Token.IQuantity;
      bVar3 = t->Material != (Material *)0x0;
      if (bVar3) {
        Token.IQuantity = Token.IQuantity + -1;
      }
      uVar4 = bVar3 && iVar2 != 0;
      if (!bVar3 || iVar2 == 0) break;
      t->Material = t->Material->Next;
    }
    if (Token.IQuantity != -1) break;
    ExpectToken(TK_OPENBRACE);
    t->Next = *(Triangle **)(in_RDI + 0xf8);
    *(Triangle **)(in_RDI + 0xf8) = t;
    local_24 = 3;
    iVar2 = local_24;
    while (local_24 = iVar2, iVar2 = local_24 + -1, local_24 != 0) {
      if ((t->EdgeFlags[iVar2] & 0x100) != 0) {
        in_stack_ffffffffffffffe0 = *(undefined8 *)(in_RDI + 0xf0);
        pEVar1 = NewEdge();
        *(Edge **)(in_RDI + 0xf0) = pEVar1;
        *(Material **)(*(long *)(in_RDI + 0xf0) + 0x20) = t->Material;
        *(undefined8 *)(*(long *)(in_RDI + 0xf0) + 0x28) = in_stack_ffffffffffffffe0;
        *(Vertex **)(*(long *)(in_RDI + 0xf0) + 0x48) = t->Edges[iVar2];
        *(Vertex **)(*(long *)(in_RDI + 0xf0) + 0x50) = t->Edges[local_24 % 3];
        InitEdge((Edge *)CONCAT17(uVar4,in_stack_ffffffffffffffd0),(int)((ulong)t >> 0x20));
      }
    }
  }
  Error = 1;
  snprintf(ErrorText,0x400,"Unknown material referenced at line %d",(ulong)(uint)Lines);
  return;
}

Assistant:

void LoadTriangles(struct Level *NewLev, int radius)
{
   struct Triangle *Tri;
   struct Edge *NextEdge;
   int c;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Tri = NewTriangle();

               /* read vertex pointers & edge flags */
               GetVert(NewLev, Tri, 0);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 1);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 2);
               ExpectToken(TK_COMMA);

               /* read material reference and store correct pointer */
               ExpectToken(TK_NUMBER);

               Tri->Material = NewLev->AllMats;
               while (Tri->Material && Token.IQuantity--)
                  Tri->Material = Tri->Material->Next;
               if (Token.IQuantity != -1) {
                  Error = 1;
                  snprintf(ErrorText, sizeof(ErrorText),
                            "Unknown material referenced at line %d", Lines);
                  return;
               }

               /* expect end of this triangle */
               ExpectToken(TK_CLOSEBRACE);

               /* insert new triangle into total level list */
               Tri->Next = NewLev->AllTris;
               NewLev->AllTris = Tri;

               /* generate edges */
               c = 3;
               while (c--) {
                  if (Tri->EdgeFlags[c] & FLAGS_COLLIDABLE) {
                     NextEdge = NewLev->AllEdges;
                     NewLev->AllEdges = NewEdge();
                     NewLev->AllEdges->Material = Tri->Material;
                     NewLev->AllEdges->Next = NextEdge;

                     NewLev->AllEdges->EndPoints[0] = Tri->Edges[c];
                     NewLev->AllEdges->EndPoints[1] = Tri->Edges[(c + 1) % 3];

                     InitEdge(NewLev->AllEdges, radius);
                  }
               }
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}